

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  char *pcVar1;
  runtime_error *this_00;
  LargestUInt in_RDX;
  allocator *paVar2;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  switch(this->field_0x8) {
  case 0:
    pcVar1 = "";
    paVar2 = &local_11;
    break;
  case 1:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,in_RDX);
    return __return_storage_ptr__;
  case 2:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,in_RDX);
    return __return_storage_ptr__;
  case 3:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)this,(this->value_).real_);
    return __return_storage_ptr__;
  case 4:
    pcVar1 = "";
    if ((this->value_).string_ != (char *)0x0) {
      pcVar1 = (this->value_).string_;
    }
    paVar2 = &local_12;
    break;
  case 5:
    pcVar1 = "false";
    if ((this->value_).bool_ != false) {
      pcVar1 = "true";
    }
    paVar2 = &local_13;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Type is not convertible to string");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
    return value_.string_ ? value_.string_ : "";
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}